

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_NtkPrintVecWin(Acb_Ntk_t *p,Vec_Int_t *vVec,char *pName)

{
  long lVar1;
  
  printf("%s: \n",pName);
  if (0 < vVec->nSize) {
    lVar1 = 0;
    do {
      if (vVec->pArray[lVar1] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      Acb_NtkPrintNode(p,(uint)vVec->pArray[lVar1] >> 1);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vVec->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Acb_NtkPrintVecWin( Acb_Ntk_t * p, Vec_Int_t * vVec, char * pName )
{
    int i;
    printf( "%s: \n", pName );
    for ( i = 0; i < vVec->nSize; i++ )
        Acb_NtkPrintNode( p, Abc_Lit2Var(vVec->pArray[i]) );
    printf( "\n" );
}